

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.h
# Opt level: O2

bool CreateAndActivateUTXOSnapshot<__25_const>(long fixture)

{
  long lVar1;
  pointer ppCVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  FILE *pFVar3;
  Chainstate *pCVar4;
  CBlockIndex *block;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  pointer in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  pointer in_stack_fffffffffffffdd8;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_218;
  int height;
  AutoFile auto_infile;
  AutoFile auto_outfile;
  Result<CBlockIndex_*> res;
  SnapshotMetadata metadata;
  UniValue result;
  path local_98;
  path snapshot_path;
  path root;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&root.super_path,(path *)(fixture + 0x198));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&metadata,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  height = ChainstateManager::ActiveHeight(*(ChainstateManager **)(fixture + 0x60));
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&metadata);
  std::filesystem::__cxx11::path::path(&local_98,&root.super_path);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&metadata,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&local_98,(path *)&metadata);
  std::filesystem::__cxx11::path::~path((path *)&metadata);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path(&local_98);
  pFVar3 = fsbridge::fopen((char *)&snapshot_path,"wb");
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffffdd0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffffdc8;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffdd8;
  AutoFile::AutoFile(&auto_outfile,(FILE *)pFVar3,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_218);
  pCVar4 = ChainstateManager::ActiveChainstate(*(ChainstateManager **)(fixture + 0x60));
  CreateUTXOSnapshot(&result,(NodeContext *)(fixture + 0x10),pCVar4,&auto_outfile,&snapshot_path,
                     &snapshot_path);
  std::filesystem::__cxx11::path::string((string *)&metadata,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)&res,(int)&result,(void *)0x0,0);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metadata,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)&metadata);
  pFVar3 = fsbridge::fopen((char *)&snapshot_path,"rb");
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar3,data_xor_00);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdc8);
  node::SnapshotMetadata::SnapshotMetadata
            (&metadata,
             (MessageStartChars)*(_Type *)(*(long *)(*(long *)(fixture + 0x60) + 0x728) + 0x170));
  node::SnapshotMetadata::Unserialize<AutoFile>(&metadata,&auto_infile);
  pCVar4 = ChainstateManager::ActiveChainstate(*(ChainstateManager **)(fixture + 0x60));
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    block = (CBlockIndex *)0x0;
  }
  else {
    block = ppCVar2[-1];
  }
  if (block->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar4->m_chain,block->pprev);
  }
  ChainstateManager::ActivateSnapshot
            (&res,*(ChainstateManager **)(fixture + 0x60),&auto_infile,&metadata,false);
  CChain::SetTip(&pCVar4->m_chain,block);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&res);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&metadata);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile(&auto_outfile);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path(&root.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_index == '\x01';
  }
  __stack_chk_fail();
}

Assistant:

static bool
CreateAndActivateUTXOSnapshot(
    TestingSetup* fixture,
    F malleation = NoMalleation,
    bool reset_chainstate = false,
    bool in_memory_chainstate = false)
{
    node::NodeContext& node = fixture->m_node;
    fs::path root = fixture->m_path_root;

    // Write out a snapshot to the test's tempdir.
    //
    int height;
    WITH_LOCK(::cs_main, height = node.chainman->ActiveHeight());
    fs::path snapshot_path = root / fs::u8path(tfm::format("test_snapshot.%d.dat", height));
    FILE* outfile{fsbridge::fopen(snapshot_path, "wb")};
    AutoFile auto_outfile{outfile};

    UniValue result = CreateUTXOSnapshot(
        node, node.chainman->ActiveChainstate(), auto_outfile, snapshot_path, snapshot_path);
    LogPrintf(
        "Wrote UTXO snapshot to %s: %s\n", fs::PathToString(snapshot_path.make_preferred()), result.write());

    // Read the written snapshot in and then activate it.
    //
    FILE* infile{fsbridge::fopen(snapshot_path, "rb")};
    AutoFile auto_infile{infile};
    node::SnapshotMetadata metadata{node.chainman->GetParams().MessageStart()};
    auto_infile >> metadata;

    malleation(auto_infile, metadata);

    if (reset_chainstate) {
        {
            // What follows is code to selectively reset chainstate data without
            // disturbing the existing BlockManager instance, which is needed to
            // recognize the headers chain previously generated by the chainstate we're
            // removing. Without those headers, we can't activate the snapshot below.
            //
            // This is a stripped-down version of node::LoadChainstate which
            // preserves the block index.
            LOCK(::cs_main);
            CBlockIndex *orig_tip = node.chainman->ActiveChainstate().m_chain.Tip();
            uint256 gen_hash = node.chainman->ActiveChainstate().m_chain[0]->GetBlockHash();
            node.chainman->ResetChainstates();
            node.chainman->InitializeChainstate(node.mempool.get());
            Chainstate& chain = node.chainman->ActiveChainstate();
            Assert(chain.LoadGenesisBlock());
            // These cache values will be corrected shortly in `MaybeRebalanceCaches`.
            chain.InitCoinsDB(1 << 20, true, false, "");
            chain.InitCoinsCache(1 << 20);
            chain.CoinsTip().SetBestBlock(gen_hash);
            chain.setBlockIndexCandidates.insert(node.chainman->m_blockman.LookupBlockIndex(gen_hash));
            chain.LoadChainTip();
            node.chainman->MaybeRebalanceCaches();

            // Reset the HAVE_DATA flags below the snapshot height, simulating
            // never-having-downloaded them in the first place.
            // TODO: perhaps we could improve this by using pruning to delete
            // these blocks instead
            CBlockIndex *pindex = orig_tip;
            while (pindex && pindex != chain.m_chain.Tip()) {
                // Remove all data and validity flags by just setting
                // BLOCK_VALID_TREE. Also reset transaction counts and sequence
                // ids that are set when blocks are received, to make test setup
                // more realistic and satisfy consistency checks in
                // CheckBlockIndex().
                assert(pindex->IsValid(BlockStatus::BLOCK_VALID_TREE));
                pindex->nStatus = BlockStatus::BLOCK_VALID_TREE;
                pindex->nTx = 0;
                pindex->m_chain_tx_count = 0;
                pindex->nSequenceId = 0;
                pindex = pindex->pprev;
            }
        }
        BlockValidationState state;
        if (!node.chainman->ActiveChainstate().ActivateBestChain(state)) {
            throw std::runtime_error(strprintf("ActivateBestChain failed. (%s)", state.ToString()));
        }
        Assert(
            0 == WITH_LOCK(node.chainman->GetMutex(), return node.chainman->ActiveHeight()));
    }

    auto& new_active = node.chainman->ActiveChainstate();
    auto* tip = new_active.m_chain.Tip();

    // Disconnect a block so that the snapshot chainstate will be ahead, otherwise
    // it will refuse to activate.
    //
    // TODO this is a unittest-specific hack, and we should probably rethink how to
    // better generate/activate snapshots in unittests.
    if (tip->pprev) {
        new_active.m_chain.SetTip(*(tip->pprev));
    }

    auto res = node.chainman->ActivateSnapshot(auto_infile, metadata, in_memory_chainstate);

    // Restore the old tip.
    new_active.m_chain.SetTip(*tip);
    return !!res;
}